

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O0

void __thiscall Assimp::MakeLeftHandedProcess::Execute(MakeLeftHandedProcess *this,aiScene *pScene)

{
  aiNode *pNode;
  aiAnimation *paVar1;
  Logger *pLVar2;
  aiNodeAnim *nodeAnim;
  uint b;
  aiAnimation *anim;
  uint local_60;
  uint a_2;
  uint a_1;
  uint a;
  aiScene *local_18;
  aiScene *pScene_local;
  MakeLeftHandedProcess *this_local;
  
  local_18 = pScene;
  pScene_local = (aiScene *)this;
  if (pScene->mRootNode != (aiNode *)0x0) {
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"MakeLeftHandedProcess begin");
    pNode = local_18->mRootNode;
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&a_1);
    ProcessNode(this,pNode,(aiMatrix4x4 *)&a_1);
    for (a_2 = 0; a_2 < local_18->mNumMeshes; a_2 = a_2 + 1) {
      ProcessMesh(this,local_18->mMeshes[a_2]);
    }
    for (local_60 = 0; local_60 < local_18->mNumMaterials; local_60 = local_60 + 1) {
      ProcessMaterial(this,local_18->mMaterials[local_60]);
    }
    for (anim._4_4_ = 0; anim._4_4_ < local_18->mNumAnimations; anim._4_4_ = anim._4_4_ + 1) {
      paVar1 = local_18->mAnimations[anim._4_4_];
      for (nodeAnim._4_4_ = 0; nodeAnim._4_4_ < paVar1->mNumChannels;
          nodeAnim._4_4_ = nodeAnim._4_4_ + 1) {
        ProcessAnimation(this,paVar1->mChannels[nodeAnim._4_4_]);
      }
    }
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"MakeLeftHandedProcess finished");
    return;
  }
  __assert_fail("pScene->mRootNode != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ConvertToLHProcess.cpp"
                ,0x6a,"virtual void Assimp::MakeLeftHandedProcess::Execute(aiScene *)");
}

Assistant:

void MakeLeftHandedProcess::Execute( aiScene* pScene)
{
    // Check for an existent root node to proceed
    ai_assert(pScene->mRootNode != NULL);
    ASSIMP_LOG_DEBUG("MakeLeftHandedProcess begin");

    // recursively convert all the nodes
    ProcessNode( pScene->mRootNode, aiMatrix4x4());

    // process the meshes accordingly
    for ( unsigned int a = 0; a < pScene->mNumMeshes; ++a ) {
        ProcessMesh( pScene->mMeshes[ a ] );
    }

    // process the materials accordingly
    for ( unsigned int a = 0; a < pScene->mNumMaterials; ++a ) {
        ProcessMaterial( pScene->mMaterials[ a ] );
    }

    // transform all animation channels as well
    for( unsigned int a = 0; a < pScene->mNumAnimations; a++)
    {
        aiAnimation* anim = pScene->mAnimations[a];
        for( unsigned int b = 0; b < anim->mNumChannels; b++)
        {
            aiNodeAnim* nodeAnim = anim->mChannels[b];
            ProcessAnimation( nodeAnim);
        }
    }
    ASSIMP_LOG_DEBUG("MakeLeftHandedProcess finished");
}